

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void compact_array_suite::test_int32(void)

{
  undefined4 local_110 [2];
  undefined4 local_108 [2];
  undefined4 local_100 [2];
  undefined4 local_f8 [4];
  char *msg;
  int iStack_d8;
  undefined1 auStack_d4 [4];
  int32_t value [4];
  iarchive in;
  value_type input [18];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x12023121110110ac;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[18]>
            ((iarchive *)(value + 2),
             (uchar (*) [18])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x48));
  iStack_d8 = 0x7fffffff;
  auStack_d4 = (undefined1  [4])0x7fffffff;
  value[0] = 0x7fffffff;
  value[1] = 0x7fffffff;
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)(value + 2),
             (int (*) [4])&iStack_d8);
  local_f8[0] = 0x31211101;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("value[0]","INT32_C(0x31211101)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x1bc,"void compact_array_suite::test_int32()",&iStack_d8,local_f8);
  local_100[0] = 0x32221202;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("value[1]","INT32_C(0x32221202)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x1bd,"void compact_array_suite::test_int32()",auStack_d4,local_100);
  local_108[0] = 0x33231303;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("value[2]","INT32_C(0x33231303)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x1be,"void compact_array_suite::test_int32()",value,local_108);
  local_110[0] = 0x34241404;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("value[3]","INT32_C(0x34241404)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x1bf,"void compact_array_suite::test_int32()",value + 1,local_110);
  trial::protocol::bintoken::iarchive::~iarchive((iarchive *)(value + 2));
  return;
}

Assistant:

void test_int32()
{
    const value_type input[] = { token::code::array8_int32, 4 * token::int32::size,
                                 0x01, 0x11, 0x21, 0x31,
                                 0x02, 0x12, 0x22, 0x32,
                                 0x03, 0x13, 0x23, 0x33,
                                 0x04, 0x14, 0x24, 0x34 };
    format::iarchive in(input);
    std::int32_t value[4] = { std::numeric_limits<std::int32_t>::max(),
                              std::numeric_limits<std::int32_t>::max(),
                              std::numeric_limits<std::int32_t>::max(),
                              std::numeric_limits<std::int32_t>::max() };
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], INT32_C(0x31211101));
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], INT32_C(0x32221202));
    TRIAL_PROTOCOL_TEST_EQUAL(value[2], INT32_C(0x33231303));
    TRIAL_PROTOCOL_TEST_EQUAL(value[3], INT32_C(0x34241404));
}